

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * cmsys::regnode(char op)

{
  char *pcVar1;
  
  pcVar1 = regcode;
  if (regcode != &regdummy) {
    *regcode = op;
    regcode[1] = '\0';
    regcode[2] = '\0';
    regcode = regcode + 3;
    return pcVar1;
  }
  regsize = regsize + 3;
  return &regdummy;
}

Assistant:

static char* regnode (char op) {
    char* ret;
    char* ptr;

    ret = regcode;
    if (ret == &regdummy) {
        regsize += 3;
        return (ret);
    }

    ptr = ret;
    *ptr++ = op;
    *ptr++ = '\0';              // Null "next" pointer.
    *ptr++ = '\0';
    regcode = ptr;

    return (ret);
}